

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  StringArg ip;
  sz_pid_t sVar1;
  int iVar2;
  int iVar3;
  self *psVar4;
  LogStream *this;
  SourceFile file;
  undefined1 local_10d8 [8];
  EchoServer server;
  undefined1 local_108 [8];
  EventLoop loop;
  undefined4 local_50;
  undefined1 local_44 [8];
  InetAddress listenAddr;
  
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)
               &loop.m_pendingFunctors.
                super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/tcp_echo/tcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)loop.m_pendingFunctors.
                          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    file.m_size = local_50;
    sznet::Logger::Logger((Logger *)local_10d8,file,0x81);
    psVar4 = sznet::LogStream::operator<<((LogStream *)&server,"pid = ");
    sVar1 = sznet::sz_getpid();
    this = sznet::LogStream::operator<<(psVar4,sVar1);
    psVar4 = sznet::LogStream::operator<<(this,", tid = ");
    sVar1 = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar4,sVar1);
    sznet::Logger::~Logger((Logger *)local_10d8);
  }
  if (argc < 5) {
    printf("Usage: %s ip port thread_num mode(1-echo, others-RTT)\n",*argv);
  }
  else {
    ip.m_str = argv[1];
    iVar2 = atoi(argv[2]);
    iVar3 = atoi(argv[3]);
    numThreads = 2;
    if (iVar3 != 0) {
      numThreads = iVar3;
    }
    iVar3 = atoi(argv[4]);
    sznet::net::EventLoop::EventLoop((EventLoop *)local_108);
    g_pMainLoopsRun = (EventLoop *)local_108;
    sznet::net::InetAddress::InetAddress((InetAddress *)local_44,ip,(uint16_t)iVar2,false);
    EchoServer::EchoServer
              ((EchoServer *)local_10d8,(EventLoop *)local_108,(InetAddress *)local_44,iVar3);
    EchoServer::start((EchoServer *)local_10d8);
    sznet::net::EventLoop::loop((EventLoop *)local_108);
    EchoServer::~EchoServer((EchoServer *)local_10d8);
    sznet::net::EventLoop::~EventLoop((EventLoop *)local_108);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();
    if (argc <= 4)
    {
        printf("Usage: %s ip port thread_num mode(1-echo, others-RTT)\n", argv[0]);
        return 0;
    }

    char* szSvrip = argv[1];
    uint16_t sSvrPort= static_cast<uint16_t>(atoi(argv[2]));
    numThreads = atoi(argv[3]);
    numThreads = (numThreads == 0 ? 2 : numThreads);
    int mode = atoi(argv[4]);

    EventLoop loop;
    g_pMainLoopsRun = &loop;
    InetAddress listenAddr(szSvrip, sSvrPort);
    EchoServer server(&loop, listenAddr, mode);

    server.start();

    loop.loop();

    return 0;
}